

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O2

void wirehair::AddInvertibleGF2Matrix(uint64_t *matrix,uint offset,uint pitchWords,uint n)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong uVar12;
  ulong *puVar13;
  ulong *puVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  
  uVar7 = (ulong)offset;
  if (n < 0x200) {
    uVar18 = (ulong)(offset & 0x3f);
    uVar15 = 0x40 - (offset & 0x3f);
    puVar11 = matrix + (offset >> 6);
    puVar13 = matrix + (ulong)(offset >> 6) + 1;
    uVar7 = ~(-1L << ((ulong)n & 0x3f));
    lVar1 = (ulong)(byte)kInvertibleMatrixSeeds[n] * 2 + 1;
    uVar10 = lVar1 * 0x5851f42d4c957f2e;
    uVar9 = n;
    if (uVar15 < n) {
      uVar9 = uVar15;
    }
    if (0x3f < n) {
      uVar7 = 0xffffffffffffffff;
      uVar9 = uVar15;
    }
    for (uVar19 = 0; uVar19 != n; uVar19 = uVar19 + 1) {
      uVar16 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
      bVar3 = (byte)(uVar10 >> 0x3b);
      uVar10 = uVar10 * 0x5851f42d4c957f2d + lVar1;
      uVar5 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
      bVar4 = (byte)(uVar10 >> 0x3b);
      uVar10 = uVar10 * 0x5851f42d4c957f2d + lVar1;
      uVar17 = CONCAT44(uVar5 >> bVar4 | uVar5 << 0x20 - bVar4,
                        uVar16 >> bVar3 | uVar16 << 0x20 - bVar3);
      *puVar11 = *puVar11 ^ (uVar17 & uVar7) << uVar18;
      uVar12 = (ulong)(n - uVar9);
      puVar14 = puVar13;
      if (n != uVar9) {
        do {
          uVar6 = uVar17 >> ((ulong)uVar15 & 0x3f);
          if (uVar18 == 0) {
            uVar6 = 0;
          }
          if (uVar18 < uVar12) {
            uVar16 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
            bVar3 = (byte)(uVar10 >> 0x3b);
            uVar10 = uVar10 * 0x5851f42d4c957f2d + lVar1;
            uVar5 = (uint)(uVar10 >> 0x2d) ^ (uint)(uVar10 >> 0x1b);
            bVar4 = (byte)(uVar10 >> 0x3b);
            uVar10 = uVar10 * 0x5851f42d4c957f2d + lVar1;
            uVar17 = CONCAT44(uVar5 >> bVar4 | uVar5 << 0x20 - bVar4,
                              uVar16 >> bVar3 | uVar16 << 0x20 - bVar3);
            uVar6 = uVar6 | uVar17 << uVar18;
          }
          else {
            uVar17 = 0;
          }
          uVar8 = ~(-1L << (uVar12 & 0x3f));
          if (0x3f < uVar12) {
            uVar8 = 0xffffffffffffffff;
          }
          *puVar14 = *puVar14 ^ uVar8 & uVar6;
          bVar2 = 0x40 < uVar12;
          uVar12 = uVar12 - 0x40;
          puVar14 = puVar14 + 1;
        } while (bVar2);
      }
      puVar13 = puVar13 + pitchWords;
      puVar11 = puVar11 + pitchWords;
    }
  }
  else {
    uVar9 = offset + 1;
    for (uVar15 = 1; uVar15 - n != 1; uVar15 = uVar15 + 1) {
      matrix[uVar7 >> 6] = matrix[uVar7 >> 6] ^ 1L << (uVar7 & 0x3f);
      if (uVar15 < n) {
        matrix[uVar9 >> 6] = matrix[uVar9 >> 6] ^ 1L << ((ulong)((int)uVar7 + 1) & 0x3f);
      }
      uVar7 = (ulong)((int)uVar7 + 1);
      matrix = matrix + pitchWords;
      uVar9 = uVar9 + 1;
    }
  }
  return;
}

Assistant:

void AddInvertibleGF2Matrix(
    uint64_t * GF256_RESTRICT matrix, ///< Address of upper left word
    const unsigned offset, ///< Offset in bits to the first sum column
    const unsigned pitchWords, ///< Pitch of the matrix in words
    const unsigned n ///< Number of bits in the matrix to generate
)
{
    // If we do not have this value of n in the table:
    if (n >= kMatrixSeedCount)
    {
        uint64_t * row = matrix;

        // For each row:
        for (unsigned ii = 0; ii < n; ++ii, row += pitchWords)
        {
            // Flip diagonal bit
            const unsigned column_i = offset + ii;
            row[column_i >> 6] ^= (uint64_t)1 << (column_i & 63);

            // Flip an off-diagonal bit also
            if (ii + 1 < n) {
                const unsigned column_j = column_i + 1;
                row[column_j >> 6] ^= (uint64_t)1 << (column_j & 63);
            }
        }

        return;
    }

    // Pull a random matrix out of the lookup table
    const uint8_t seed = kInvertibleMatrixSeeds[n];

    PCGRandom prng;
    prng.Seed(seed);

    const unsigned shift = offset & 63;
    uint64_t * row = matrix + (offset >> 6);

    // For each row to generate:
    for (unsigned row_i = 0; row_i < n; ++row_i, row += pitchWords)
    {
        uint64_t * dest = row;
        unsigned target = n;

        // Unroll the first word
        uint64_t prev = 0;

        // Generate first word
        const uint64_t word0 = Random64(prng);

        uint64_t temp0 = word0;

        unsigned written0 = 64 - shift;

        // Handle short writes
        if (target < 64) {
            temp0 &= ((uint64_t)1 << target) - 1;
            if (written0 > target) {
                written0 = target;
            }
        }

        // Add partial word into front
        *dest++ ^= temp0 << shift;

        target -= written0;
        prev = word0;

        if (target <= 0) {
            continue;
        }

        // For each remaining word:
        for (;;)
        {
            uint64_t temp = 0;
            if (shift != 0) {
                temp = prev >> (64 - shift);
            }
            uint64_t word = 0;

            // If it needs another word:
            if (target > shift) {
                // Generate next word
                word = Random64(prng);
                temp |= (word << shift);
            }

            if (target < 64) {
                temp &= ((uint64_t)1 << target) - 1;
            }

            // Add partial word
            *dest ^= temp;

            if (target <= 64) {
                break;
            }

            target -= 64;
            ++dest;
            prev = word;
        }
    }
}